

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

char * cram_block_method2str(cram_block_method m)

{
  char *pcStack_10;
  cram_block_method m_local;
  
  switch(m) {
  case RAW:
    pcStack_10 = "RAW";
    break;
  case GZIP:
    pcStack_10 = "GZIP";
    break;
  case BZIP2:
    pcStack_10 = "BZIP2";
    break;
  case LZMA:
    pcStack_10 = "LZMA";
    break;
  case RANS:
    pcStack_10 = "RANS0";
    break;
  case RANS1:
    pcStack_10 = "RANS1";
    break;
  case GZIP_RLE:
    pcStack_10 = "GZIP_RLE";
    break;
  case ERROR:
  default:
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

char *cram_block_method2str(enum cram_block_method m) {
    switch(m) {
    case RAW:	   return "RAW";
    case GZIP:	   return "GZIP";
    case BZIP2:	   return "BZIP2";
    case LZMA:     return "LZMA";
    case RANS0:    return "RANS0";
    case RANS1:    return "RANS1";
    case GZIP_RLE: return "GZIP_RLE";
    case ERROR:    break;
    }
    return "?";
}